

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O0

int EventListDestroy(EventListHandle handle)

{
  EventList *event_list;
  EventListHandle handle_local;
  
  _worker_thread_exit((EventList *)handle);
  _destroy_all((EventList *)handle);
  return 0;
}

Assistant:

int EventListDestroy(EventListHandle handle) {
  EventList *event_list = (EventList *)handle;
  _worker_thread_exit(event_list);
  _destroy_all(event_list);
  return 0;
}